

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManFromIfLogicAndVars
              (Gia_Man_t *pNew,If_Man_t *pIfMan,If_Cut_t *pCutBest,Vec_Int_t *vLeaves,
              Vec_Int_t *vLeaves2,Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int i;
  word *pIn;
  word wVar11;
  word wVar12;
  ulong uVar13;
  Gia_Obj_t *pGVar14;
  long lVar15;
  uint nVars;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint i_00;
  int MaskOne [2];
  word uTruth [2];
  int pVarsAll [12];
  int pVarsThat [12];
  int pVarsThis [12];
  word pThis [64];
  word pFunc [64];
  word local_238 [65];
  ulong uVar16;
  
  uVar19 = *(uint *)&pCutBest->field_0x1c;
  nVars = uVar19 >> 0x18;
  uVar16 = (ulong)nVars;
  iVar6 = Abc_Lit2Var(pCutBest->iCutFunc);
  uVar7 = Vec_IntEntry(pIfMan->vTtDecs[uVar16],iVar6);
  uVar18 = uVar7 & 0xffff;
  i_00 = uVar7 >> 0x10 & 0x3fff;
  MaskOne[0] = uVar18;
  MaskOne[1] = i_00;
  if (0 < (int)uVar7) {
    iVar6 = pIfMan->pPars->nLutSize;
    iVar8 = iVar6 / 2;
    if ((iVar6 < 0xe) &&
       (uVar17 = iVar8 * 2,
       nVars == uVar17 || SBORROW4(nVars,uVar17) != (int)(nVars + iVar8 * -2) < 0)) {
      uVar7 = uVar7 >> 0x1e;
      uVar17 = uVar7 & 1;
      pIn = If_CutTruthWR(pIfMan,pCutBest);
      Abc_TtCopy(pFunc,pIn,pIfMan->nTruth6Words[uVar16],uVar17);
      iVar8 = pIfMan->pPars->nLutSize / 2;
      iVar6 = Abc_TtBitCount16(uVar18);
      if (iVar8 < iVar6) {
        __assert_fail("Abc_TtBitCount16(This) <= nSuppLim",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                      ,0x9b8,"void Abc_TtDeriveBiDec(word *, int, int, int, int, word *, word *)");
      }
      iVar9 = Abc_TtBitCount16(i_00);
      if (iVar8 < iVar9) {
        __assert_fail("Abc_TtBitCount16(That) <= nSuppLim",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                      ,0x9b9,"void Abc_TtDeriveBiDec(word *, int, int, int, int, word *, word *)");
      }
      wVar11 = Abc_TtDeriveBiDecOne(pFunc,nVars,uVar18);
      uTruth[0] = wVar11;
      wVar12 = Abc_TtDeriveBiDecOne(pFunc,nVars,i_00);
      bVar4 = (char)(uVar19 >> 0x18) - 6U & 0x1f;
      uVar5 = 1 << bVar4;
      if (1 << bVar4 < 1) {
        uVar5 = 0;
      }
      uTruth[1] = wVar12;
      memset(pThis,0,0x200);
      pThis[0] = wVar11;
      memset(local_238,0,0x200);
      local_238[0] = wVar12;
      if (0xcffffff < uVar19) {
        __assert_fail("nVars <= 12",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                      ,0x97e,"int Abc_TtVerifyBiDec(word *, int, int, int, int, word, word)");
      }
      for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
        pVarsAll[uVar13] = (int)uVar13;
      }
      iVar8 = 0;
      for (uVar10 = 0; nVars != uVar10; uVar10 = uVar10 + 1) {
        if ((uVar18 >> (uVar10 & 0x1f) & 1) != 0) {
          lVar15 = (long)iVar8;
          iVar8 = iVar8 + 1;
          pVarsThis[lVar15] = uVar10;
        }
      }
      if (iVar8 != iVar6) {
        __assert_fail("k == nThis",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                      ,0x984,"int Abc_TtVerifyBiDec(word *, int, int, int, int, word, word)");
      }
      iVar8 = 0;
      for (uVar18 = 0; nVars != uVar18; uVar18 = uVar18 + 1) {
        if ((i_00 >> (uVar18 & 0x1f) & 1) != 0) {
          lVar15 = (long)iVar8;
          iVar8 = iVar8 + 1;
          pVarsThat[lVar15] = uVar18;
        }
      }
      if (iVar8 != iVar9) {
        __assert_fail("k == nThat",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                      ,0x988,"int Abc_TtVerifyBiDec(word *, int, int, int, int, word, word)");
      }
      Abc_TtStretch6(pThis,iVar6,nVars);
      Abc_TtStretch6(local_238,iVar9,nVars);
      Abc_TtExpand(pThis,nVars,pVarsThis,iVar6,pVarsAll,nVars);
      Abc_TtExpand(local_238,nVars,pVarsThat,iVar9,pVarsAll,nVars);
      uVar16 = (ulong)uVar5;
      if (uVar19 < 0x7000000) {
        uVar16 = 1;
      }
      uVar13 = 0;
      do {
        if (uVar16 == uVar13) goto LAB_005a995e;
        puVar1 = local_238 + uVar13;
        puVar2 = pThis + uVar13;
        puVar3 = pFunc + uVar13;
        uVar13 = uVar13 + 1;
      } while (*puVar3 == (*puVar1 & *puVar2));
      puts("Bi-decomposition verification failed.");
LAB_005a995e:
      uTruth[0] = wVar11 ^ (long)(int)-uVar7;
      uTruth[1] = wVar12 ^ (long)(int)-uVar7;
      lVar15 = 0;
      while( true ) {
        if (lVar15 == 2) {
          iVar6 = Abc_LitNotCond((int)pThis[0],uVar17);
          iVar8 = Abc_LitNotCond(pThis[0]._4_4_,uVar17);
          iVar9 = Gia_ManAppendAnd(pNew,iVar6,iVar8);
          uVar19 = Abc_LitIsCompl(pCutBest->iCutFunc);
          iVar9 = Abc_LitNotCond(iVar9,uVar7 ^ uVar19);
          i = Abc_Lit2Var(iVar9);
          Vec_IntSetEntry(vMapping,i,vMapping2->nSize);
          Vec_IntPush(vMapping2,2);
          iVar6 = Abc_Lit2Var(iVar6);
          Vec_IntPush(vMapping2,iVar6);
          iVar6 = Abc_Lit2Var(iVar8);
          Vec_IntPush(vMapping2,iVar6);
          iVar6 = Abc_Lit2Var(iVar9);
          Vec_IntPush(vMapping2,-iVar6);
          iVar6 = Abc_LitNotCond(iVar9,*(uint *)&pCutBest->field_0x1c >> 0xc & 1);
          return iVar6;
        }
        vLeaves2->nSize = 0;
        for (uVar19 = 0; nVars != uVar19; uVar19 = uVar19 + 1) {
          if (((uint)MaskOne[lVar15] >> (uVar19 & 0x1f) & 1) != 0) {
            iVar6 = Vec_IntEntry(vLeaves,uVar19);
            Vec_IntPush(vLeaves2,iVar6);
          }
        }
        if (vLeaves2->nSize < 1) break;
        iVar6 = Kit_TruthToGia(pNew,(uint *)(uTruth + lVar15),vLeaves2->nSize,vCover,vLeaves2,0);
        *(int *)((long)pThis + lVar15 * 4) = iVar6;
        if (vLeaves2->nSize != 1) {
          iVar8 = Abc_Lit2Var(iVar6);
          pGVar14 = Gia_ManObj(pNew,iVar8);
          if (((int)(uint)*(undefined8 *)pGVar14 < 0) ||
             (((uint)*(undefined8 *)pGVar14 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c])))",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                          ,0x6ab,
                          "int Gia_ManFromIfLogicAndVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          iVar8 = Abc_Lit2Var(iVar6);
          Vec_IntSetEntry(vMapping,iVar8,vMapping2->nSize);
          Vec_IntPush(vMapping2,vLeaves2->nSize);
          for (iVar8 = 0; iVar8 < vLeaves2->nSize; iVar8 = iVar8 + 1) {
            iVar9 = Vec_IntEntry(vLeaves2,iVar8);
            iVar9 = Abc_Lit2Var(iVar9);
            Vec_IntPush(vMapping2,iVar9);
          }
          iVar6 = Abc_Lit2Var(iVar6);
          Vec_IntPush(vMapping2,iVar6);
        }
        lVar15 = lVar15 + 1;
      }
      __assert_fail("Vec_IntSize(vLeaves2) >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x6a6,
                    "int Gia_ManFromIfLogicAndVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
  }
  __assert_fail("Mask > 0 && nLeaves <= 2 * (pIfMan->pPars->nLutSize/2) && pIfMan->pPars->nLutSize <= 13"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                ,0x69b,
                "int Gia_ManFromIfLogicAndVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

int Gia_ManFromIfLogicAndVars( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Cut_t * pCutBest, Vec_Int_t * vLeaves, Vec_Int_t * vLeaves2, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2 )
{
    word pFunc[64], uTruth[2];
    int nLeaves = pCutBest->nLeaves;
    int truthId = Abc_Lit2Var(pCutBest->iCutFunc);
    int c, k, Mask = Vec_IntEntry(pIfMan->vTtDecs[nLeaves], truthId);
    int MaskOne[2] = { Mask & 0xFFFF, (Mask >> 16) & 0x3FFF };
    int iLitCofs[2], iTemp, fOrDec = (Mask >> 30) & 1, RetValue = -1; 
    assert( Mask > 0 && nLeaves <= 2 * (pIfMan->pPars->nLutSize/2) && pIfMan->pPars->nLutSize <= 13 );
    Abc_TtCopy( pFunc, If_CutTruthWR(pIfMan, pCutBest), pIfMan->nTruth6Words[nLeaves], fOrDec );
    Abc_TtDeriveBiDec( pFunc, nLeaves, MaskOne[0], MaskOne[1], pIfMan->pPars->nLutSize/2, &uTruth[0], &uTruth[1] );
    uTruth[0] = fOrDec ? ~uTruth[0] : uTruth[0];
    uTruth[1] = fOrDec ? ~uTruth[1] : uTruth[1];
    for ( c = 0; c < 2; c++ )
    {
        Vec_IntClear( vLeaves2 );
        for ( k = 0; k < nLeaves; k++ )
            if ( (MaskOne[c] >> k) & 1 )
                Vec_IntPush( vLeaves2, Vec_IntEntry(vLeaves, k) );
        assert( Vec_IntSize(vLeaves2) >= 1 );
        iLitCofs[c] = Kit_TruthToGia( pNew, (unsigned *)&uTruth[c], Vec_IntSize(vLeaves2), vCover, vLeaves2, 0 );
        if ( Vec_IntSize(vLeaves2) == 1 )
            continue;
        // create mapping
        assert( Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c]))) );
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLitCofs[c]), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves2) );
        Vec_IntForEachEntry( vLeaves2, iTemp, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[c]) );
    }
    iLitCofs[0] = Abc_LitNotCond( iLitCofs[0], fOrDec );
    iLitCofs[1] = Abc_LitNotCond( iLitCofs[1], fOrDec );
    RetValue = Gia_ManAppendAnd( pNew, iLitCofs[0], iLitCofs[1] );
    RetValue = Abc_LitNotCond( RetValue, fOrDec ^ Abc_LitIsCompl(pCutBest->iCutFunc) );
    // create mapping
    Vec_IntSetEntry( vMapping, Abc_Lit2Var(RetValue), Vec_IntSize(vMapping2) );
    Vec_IntPush( vMapping2, 2 );
    Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[0]) );
    Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[1]) );
    Vec_IntPush( vMapping2, -Abc_Lit2Var(RetValue) );
    RetValue = Abc_LitNotCond( RetValue, pCutBest->fCompl );
    return RetValue;
}